

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<double>_>::Subtract
          (TPZMatrix<Fad<double>_> *this,TPZMatrix<Fad<double>_> *A,TPZMatrix<Fad<double>_> *res)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  int sz;
  TPZFMatrix<Fad<double>_> ref;
  Fad<double> local_178;
  undefined1 local_158 [152];
  undefined1 local_c0 [144];
  
  if (((this->super_TPZBaseMatrix).fRow != (A->super_TPZBaseMatrix).fRow) ||
     ((this->super_TPZBaseMatrix).fCol != (A->super_TPZBaseMatrix).fCol)) {
    Error("Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>",(char *)0x0);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(this);
  iVar4 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])();
  if (CONCAT44(extraout_var,iVar3) == CONCAT44(extraout_var_00,iVar4)) {
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
    lVar5 = __dynamic_cast(res,&TPZMatrix<Fad<double>>::typeinfo,&TPZFMatrix<Fad<double>>::typeinfo,
                           0);
    if (lVar5 != 0) {
      lVar5 = __dynamic_cast(A,&TPZMatrix<Fad<double>>::typeinfo,&TPZFMatrix<Fad<double>>::typeinfo,
                             0);
      lVar6 = __dynamic_cast(this,&TPZMatrix<Fad<double>>::typeinfo,
                             &TPZFMatrix<Fad<double>>::typeinfo,0);
      if ((lVar6 == 0) || (lVar5 == 0)) {
        if ((this->super_TPZBaseMatrix).fRow < 1) {
          return;
        }
        lVar5 = 0;
        do {
          if (0 < (this->super_TPZBaseMatrix).fCol) {
            lVar6 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_c0,this,lVar5,lVar6);
              (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_178,A,lVar5);
              uVar2 = local_c0._8_4_;
              iVar3 = local_178.dx_.num_elts;
              local_158._0_8_ = (double)local_c0._0_8_ - local_178.val_;
              uVar1 = local_178.dx_.num_elts;
              if (local_178.dx_.num_elts < (int)local_c0._8_4_) {
                uVar1 = local_c0._8_4_;
              }
              local_158._8_4_ = 0;
              local_158._16_8_ = (double *)0x0;
              if (0 < (int)uVar1) {
                uVar10 = (ulong)uVar1;
                local_158._8_4_ = uVar1;
                local_158._16_8_ = operator_new__(uVar10 * 8);
                local_158._24_8_ = 0.0;
                if (0 < (int)uVar1) {
                  lVar7 = 0;
                  do {
                    pdVar8 = (double *)(local_c0._16_8_ + lVar7);
                    if (uVar2 == 0) {
                      pdVar8 = (double *)(local_c0 + 0x18);
                    }
                    pdVar9 = (double *)((long)local_178.dx_.ptr_to_data + lVar7);
                    if (iVar3 == 0) {
                      pdVar9 = &local_178.defaultVal;
                    }
                    *(double *)(local_158._16_8_ + lVar7) = *pdVar8 - *pdVar9;
                    lVar7 = lVar7 + 8;
                    uVar10 = uVar10 - 1;
                  } while (uVar10 != 0);
                }
              }
              local_158._24_8_ = 0.0;
              (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (res,lVar5,lVar6,(Fad<double> *)local_158);
              Fad<double>::~Fad((Fad<double> *)local_158);
              Fad<double>::~Fad(&local_178);
              Fad<double>::~Fad((Fad<double> *)local_c0);
              lVar6 = lVar6 + 1;
            } while (lVar6 < (this->super_TPZBaseMatrix).fCol);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (this->super_TPZBaseMatrix).fRow);
        return;
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4a])(this,res,A);
    iVar3 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(A);
    iVar4 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4d])(A);
    TPZFMatrix<Fad<double>_>::TPZFMatrix
              ((TPZFMatrix<Fad<double>_> *)local_c0,CONCAT44(extraout_var_01,iVar3),1,
               (Fad<double> *)CONCAT44(extraout_var_02,iVar4),CONCAT44(extraout_var_01,iVar3));
    Storage((TPZFMatrixRef<Fad<double>_> *)local_158,res);
    TPZFMatrix<Fad<double>_>::operator-=
              ((TPZFMatrix<Fad<double>_> *)local_158,(TPZMatrix<Fad<double>_> *)local_c0);
    TPZFMatrixRef<Fad<double>_>::~TPZFMatrixRef
              ((TPZFMatrixRef<Fad<double>_> *)local_158,&TPZFMatrixRef<Fad<double>>::VTT);
    TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_c0);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZMatrix<Fad<double>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = Fad<double>]"
             ,0x69);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n",0x2f);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x698);
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}